

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O1

void __thiscall
burst::k_ary_search_set<int,std::greater<void>>::
fill_node<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
          (k_ary_search_set<int,std::greater<void>> *this,k_ary_search_set_branch *branch,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *counters,
          iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *range)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  reference piVar4;
  pointer puVar5;
  int *piVar6;
  int *piVar7;
  ulong uVar8;
  
  puVar5 = (counters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(counters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar5 == 8) {
    lVar3 = 1;
  }
  else {
    uVar8 = 0;
    do {
      piVar4 = boost::iterator_range_detail::
               iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
               ::operator[](&range->
                             super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
                            ,puVar5[uVar8] + branch->preceding_elements);
      *(int *)(branch->index * 4 + *(long *)this + uVar8 * 4) = *piVar4;
      uVar8 = uVar8 + 1;
      puVar5 = (counters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_start;
      lVar3 = (long)(counters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3;
    } while (uVar8 < lVar3 - 1U);
  }
  piVar1 = (int *)(*(long *)this + branch->index * 4);
  piVar6 = piVar1 + lVar3 + -1;
  piVar7 = piVar6;
  if (piVar1 != piVar6) {
    lVar3 = lVar3 * 4 + -8;
    piVar1 = (int *)(*(long *)this + branch->index * 4);
    do {
      piVar7 = piVar1 + 1;
      if (lVar3 == 0) break;
      lVar3 = lVar3 + -4;
      iVar2 = *piVar1;
      piVar1 = piVar7;
    } while (*piVar7 <= iVar2);
  }
  if (piVar7 == piVar6) {
    return;
  }
  __assert_fail("std::is_sorted ( m_values.begin() + static_cast<difference_type>(branch.index), m_values.begin() + static_cast<difference_type>(branch.index + counters.size() - 1), m_compare )"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/k_ary_search_set.hpp"
                ,0x1bc,
                "void burst::k_ary_search_set<int, std::greater<void>>::fill_node(const k_ary_search_set_branch &, const std::vector<std::size_t> &, const RandomAccessRange &) [Value = int, Compare = std::greater<void>, RandomAccessRange = boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>]"
               );
}

Assistant:

void
            fill_node
            (
                const k_ary_search_set_branch & branch,
                const std::vector<std::size_t> & counters,
                const RandomAccessRange & range
            )
        {
            for
            (
                std::size_t element_index = 0;
                element_index < counters.size() - 1;
                ++element_index
            )
            {
                using difference_type = typename RandomAccessRange::difference_type;
                const auto index_in_initial_range =
                    static_cast<difference_type>
                    (
                        branch.preceding_elements + counters[element_index]
                    );
                m_values[branch.index + element_index] = range[index_in_initial_range];
            }
            BOOST_ASSERT(std::is_sorted
            (
                m_values.begin() + static_cast<difference_type>(branch.index),
                m_values.begin() + static_cast<difference_type>(branch.index + counters.size() - 1),
                m_compare
            ));
        }